

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.h
# Opt level: O3

void bsplib::serial<unsigned_int>(A2A *a2a,int pid,uint x)

{
  bool bVar1;
  ulong uVar2;
  size_t __n;
  uint __flags;
  Buffer buf;
  byte local_5 [5];
  
  __n = 0;
  uVar2 = (ulong)x;
  do {
    __flags = x & 0x7f;
    uVar2 = uVar2 >> 7;
    local_5[__n] = (0x7f < x) << 7 | (byte)__flags;
    __n = __n + 1;
    bVar1 = 0x7f < x;
    x = (uint)uVar2;
  } while (bVar1);
  A2A::send(a2a,pid,local_5,__n,__flags);
  return;
}

Assistant:

void serial( A2A & a2a, int pid, UInt x ) {
    typedef UIntSerialize< UInt > S;     
    typename S::Buffer buf;
    { const int n = S::write(x, buf );
      a2a.send( pid, buf, n );
    }
}